

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmGeneratorTarget::GetIncludeDirectories
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *lang)

{
  cmTarget *pcVar1;
  cmMakefile *pcVar2;
  auto_ptr<cmCompiledGeneratorExpression> aVar3;
  bool bVar4;
  int iVar5;
  char *__s;
  size_t sVar6;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var7;
  cmLinkImplementationLibraries *pcVar8;
  pointer in_relative;
  bool bVar9;
  string libDir;
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  linkInterfaceIncludeDirectoriesEntries;
  undefined1 local_190 [8];
  cmGeneratorExpression ge;
  auto_ptr<cmCompiledGeneratorExpression> local_160;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugProperties;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uniqueIncludes;
  cmGeneratorExpressionDAGChecker dagChecker;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uniqueIncludes._M_h._M_buckets = &uniqueIncludes._M_h._M_single_bucket;
  uniqueIncludes._M_h._M_bucket_count = 1;
  uniqueIncludes._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  uniqueIncludes._M_h._M_element_count = 0;
  uniqueIncludes._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  uniqueIncludes._M_h._M_rehash_policy._M_next_resize = 0;
  uniqueIncludes._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pcVar1 = this->Target;
  libDir._M_dataplus._M_p = (pointer)&libDir.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&libDir,"INCLUDE_DIRECTORIES","");
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            (&dagChecker,&pcVar1->Name,&libDir,(GeneratorExpressionContent *)0x0,
             (cmGeneratorExpressionDAGChecker *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)libDir._M_dataplus._M_p != &libDir.field_2) {
    operator_delete(libDir._M_dataplus._M_p,libDir.field_2._M_allocated_capacity + 1);
  }
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar2 = this->Makefile;
  libDir._M_dataplus._M_p = (pointer)&libDir.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&libDir,"CMAKE_DEBUG_TARGET_PROPERTIES","");
  __s = cmMakefile::GetDefinition(pcVar2,&libDir);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)libDir._M_dataplus._M_p != &libDir.field_2) {
    operator_delete(libDir._M_dataplus._M_p,libDir.field_2._M_allocated_capacity + 1);
  }
  if (__s != (char *)0x0) {
    libDir._M_dataplus._M_p = (pointer)&libDir.field_2;
    sVar6 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&libDir,__s,__s + sVar6);
    cmSystemTools::ExpandListArgument(&libDir,&debugProperties,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)libDir._M_dataplus._M_p != &libDir.field_2) {
      operator_delete(libDir._M_dataplus._M_p,libDir.field_2._M_allocated_capacity + 1);
    }
  }
  if (this->DebugIncludesDone == false) {
    _Var7 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[20]>>
                      (debugProperties.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       debugProperties.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,"INCLUDE_DIRECTORIES");
    bVar9 = _Var7._M_current !=
            debugProperties.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    bVar9 = false;
  }
  if (this->GlobalGenerator->ConfigureDoneCMP0026AndCMP0024 == true) {
    this->DebugIncludesDone = true;
  }
  processIncludeDirectories
            (this,(vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                   *)(this->IncludeDirectoriesEntries).
                     super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(this->IncludeDirectoriesEntries).
                super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                ._M_impl.super__Vector_impl_data._M_finish,
             (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)__return_storage_ptr__,(cmGeneratorExpressionDAGChecker *)&uniqueIncludes,
             (string *)&dagChecker,SUB81(config,0),(string *)(ulong)bVar9);
  linkInterfaceIncludeDirectoriesEntries.
  super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  linkInterfaceIncludeDirectoriesEntries.
  super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  linkInterfaceIncludeDirectoriesEntries.
  super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  libDir._M_dataplus._M_p = (pointer)&libDir.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&libDir,"INTERFACE_INCLUDE_DIRECTORIES","");
  AddInterfaceEntries(this,config,&libDir,&linkInterfaceIncludeDirectoriesEntries);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)libDir._M_dataplus._M_p != &libDir.field_2) {
    operator_delete(libDir._M_dataplus._M_p,libDir.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = this->Makefile;
  libDir._M_dataplus._M_p = (pointer)&libDir.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&libDir,"APPLE","");
  bVar4 = cmMakefile::IsOn(pcVar2,&libDir);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)libDir._M_dataplus._M_p != &libDir.field_2) {
    operator_delete(libDir._M_dataplus._M_p,libDir.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    pcVar8 = GetLinkImplementationLibrariesInternal(this,config,this);
    in_relative = (pcVar8->Libraries).
                  super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (in_relative !=
        (pcVar8->Libraries).super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      do {
        cmsys::SystemTools::CollapseFullPath(&libDir,(string *)in_relative);
        if ((GetIncludeDirectories(std::__cxx11::string_const&,std::__cxx11::string_const&)::
             frameworkCheck == '\0') &&
           (iVar5 = __cxa_guard_acquire(&GetIncludeDirectories(std::__cxx11::string_const&,std::__cxx11::string_const&)
                                         ::frameworkCheck), iVar5 != 0)) {
          GetIncludeDirectories::frameworkCheck.program = (char *)0x0;
          cmsys::RegularExpression::compile
                    (&GetIncludeDirectories::frameworkCheck,
                     "(.*\\.framework)(/Versions/[^/]+)?/[^/]+$");
          __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                       &GetIncludeDirectories::frameworkCheck,&__dso_handle);
          __cxa_guard_release(&GetIncludeDirectories(std::__cxx11::string_const&,std::__cxx11::string_const&)
                               ::frameworkCheck);
        }
        bVar4 = cmsys::RegularExpression::find
                          (&GetIncludeDirectories::frameworkCheck,libDir._M_dataplus._M_p);
        if (bVar4) {
          if (GetIncludeDirectories::frameworkCheck.startp[1] == (char *)0x0) {
            ge.Backtrace.Bottom.State = (cmState *)&ge.Backtrace.Bottom.Position.Position;
            ge.Backtrace.Bottom.Position.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0
            ;
            ge.Backtrace.Bottom.Position.Position._0_1_ = 0;
          }
          else {
            ge.Backtrace.Bottom.State = (cmState *)&ge.Backtrace.Bottom.Position.Position;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&ge,GetIncludeDirectories::frameworkCheck.startp[1],
                       GetIncludeDirectories::frameworkCheck.endp[1]);
          }
          std::__cxx11::string::operator=((string *)&libDir,(string *)&ge);
          if (ge.Backtrace.Bottom.State != (cmState *)&ge.Backtrace.Bottom.Position.Position) {
            operator_delete(ge.Backtrace.Bottom.State,
                            CONCAT71(ge.Backtrace.Bottom.Position.Position._1_7_,
                                     (undefined1)ge.Backtrace.Bottom.Position.Position) + 1);
          }
          cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&cge);
          cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)&cge);
          cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&cge);
          cmGeneratorExpression::Parse((cmGeneratorExpression *)local_190,(char *)&ge);
          cge.x_ = (cmCompiledGeneratorExpression *)local_190;
          local_190 = (undefined1  [8])0x0;
          ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                    ((auto_ptr<cmCompiledGeneratorExpression> *)local_190);
          local_190 = (undefined1  [8])operator_new(0x10);
          aVar3 = cge;
          cge.x_ = (cmCompiledGeneratorExpression *)0x0;
          local_160.x_ = (cmCompiledGeneratorExpression *)0x0;
          *(cmCompiledGeneratorExpression **)
           &(((cmState *)local_190)->PropertyDefinitions)._M_t._M_impl = aVar3.x_;
          *(cmLinkImplItem **)
           &(((cmState *)local_190)->PropertyDefinitions)._M_t._M_impl.super__Rb_tree_header.
            _M_header = &TargetPropertyEntry::NoLinkImplItem;
          if (linkInterfaceIncludeDirectoriesEntries.
              super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              linkInterfaceIncludeDirectoriesEntries.
              super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>
            ::_M_realloc_insert<cmGeneratorTarget::TargetPropertyEntry*>
                      ((vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>
                        *)&linkInterfaceIncludeDirectoriesEntries,
                       (iterator)
                       linkInterfaceIncludeDirectoriesEntries.
                       super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(TargetPropertyEntry **)local_190)
            ;
          }
          else {
            *linkInterfaceIncludeDirectoriesEntries.
             super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
             ._M_impl.super__Vector_impl_data._M_finish = (TargetPropertyEntry *)local_190;
            linkInterfaceIncludeDirectoriesEntries.
            super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 linkInterfaceIncludeDirectoriesEntries.
                 super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_160);
          ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&cge);
          cmGeneratorExpression::~cmGeneratorExpression(&ge);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)libDir._M_dataplus._M_p != &libDir.field_2) {
          operator_delete(libDir._M_dataplus._M_p,libDir.field_2._M_allocated_capacity + 1);
        }
        in_relative = in_relative + 1;
      } while (in_relative !=
               (pcVar8->Libraries).
               super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
  }
  processIncludeDirectories
            (this,(vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                   *)linkInterfaceIncludeDirectoriesEntries.
                     super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)linkInterfaceIncludeDirectoriesEntries.
                super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                ._M_impl.super__Vector_impl_data._M_finish,
             (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)__return_storage_ptr__,(cmGeneratorExpressionDAGChecker *)&uniqueIncludes,
             (string *)&dagChecker,SUB81(config,0),(string *)(ulong)bVar9);
  std::
  for_each<__gnu_cxx::__normal_iterator<cmGeneratorTarget::TargetPropertyEntry*const*,std::vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>>,ContainerAlgorithms::DefaultDeleter<std::vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>,false>>
            (linkInterfaceIncludeDirectoriesEntries.
             super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
             ._M_impl.super__Vector_impl_data._M_start,
             linkInterfaceIncludeDirectoriesEntries.
             super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if (linkInterfaceIncludeDirectoriesEntries.
      super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(linkInterfaceIncludeDirectoriesEntries.
                    super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)linkInterfaceIncludeDirectoriesEntries.
                          super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)linkInterfaceIncludeDirectoriesEntries.
                          super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&debugProperties);
  cmListFileBacktrace::~cmListFileBacktrace(&dagChecker.Backtrace);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&dagChecker.Seen._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dagChecker.Property._M_dataplus._M_p != &dagChecker.Property.field_2) {
    operator_delete(dagChecker.Property._M_dataplus._M_p,
                    dagChecker.Property.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dagChecker.Target._M_dataplus._M_p != &dagChecker.Target.field_2) {
    operator_delete(dagChecker.Target._M_dataplus._M_p,
                    dagChecker.Target.field_2._M_allocated_capacity + 1);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&uniqueIncludes._M_h);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> cmGeneratorTarget::GetIncludeDirectories(
  const std::string& config, const std::string& lang) const
{
  std::vector<std::string> includes;
  CM_UNORDERED_SET<std::string> uniqueIncludes;

  cmGeneratorExpressionDAGChecker dagChecker(
    this->GetName(), "INCLUDE_DIRECTORIES", CM_NULLPTR, CM_NULLPTR);

  std::vector<std::string> debugProperties;
  const char* debugProp =
    this->Makefile->GetDefinition("CMAKE_DEBUG_TARGET_PROPERTIES");
  if (debugProp) {
    cmSystemTools::ExpandListArgument(debugProp, debugProperties);
  }

  bool debugIncludes = !this->DebugIncludesDone &&
    std::find(debugProperties.begin(), debugProperties.end(),
              "INCLUDE_DIRECTORIES") != debugProperties.end();

  if (this->GlobalGenerator->GetConfigureDoneCMP0026()) {
    this->DebugIncludesDone = true;
  }

  processIncludeDirectories(this, this->IncludeDirectoriesEntries, includes,
                            uniqueIncludes, &dagChecker, config, debugIncludes,
                            lang);

  std::vector<cmGeneratorTarget::TargetPropertyEntry*>
    linkInterfaceIncludeDirectoriesEntries;
  AddInterfaceEntries(this, config, "INTERFACE_INCLUDE_DIRECTORIES",
                      linkInterfaceIncludeDirectoriesEntries);

  if (this->Makefile->IsOn("APPLE")) {
    cmLinkImplementationLibraries const* impl =
      this->GetLinkImplementationLibraries(config);
    for (std::vector<cmLinkImplItem>::const_iterator it =
           impl->Libraries.begin();
         it != impl->Libraries.end(); ++it) {
      std::string libDir = cmSystemTools::CollapseFullPath(*it);

      static cmsys::RegularExpression frameworkCheck(
        "(.*\\.framework)(/Versions/[^/]+)?/[^/]+$");
      if (!frameworkCheck.find(libDir)) {
        continue;
      }

      libDir = frameworkCheck.match(1);

      cmGeneratorExpression ge;
      CM_AUTO_PTR<cmCompiledGeneratorExpression> cge =
        ge.Parse(libDir.c_str());
      linkInterfaceIncludeDirectoriesEntries.push_back(
        new cmGeneratorTarget::TargetPropertyEntry(cge));
    }
  }

  processIncludeDirectories(this, linkInterfaceIncludeDirectoriesEntries,
                            includes, uniqueIncludes, &dagChecker, config,
                            debugIncludes, lang);

  cmDeleteAll(linkInterfaceIncludeDirectoriesEntries);

  return includes;
}